

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall flatbuffers::FlatBufferBuilder::Align(FlatBufferBuilder *this,size_t elem_size)

{
  uoffset_t uVar1;
  size_t zero_pad_bytes;
  size_t elem_size_local;
  FlatBufferBuilder *this_local;
  
  if (this->minalign_ < elem_size) {
    this->minalign_ = elem_size;
  }
  uVar1 = vector_downward::size(&this->buf_);
  zero_pad_bytes = PaddingBytes((ulong)uVar1,elem_size);
  vector_downward::fill(&this->buf_,zero_pad_bytes);
  return;
}

Assistant:

void Align(size_t elem_size) {
    if (elem_size > minalign_) minalign_ = elem_size;
    buf_.fill(PaddingBytes(buf_.size(), elem_size));
  }